

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_max_fd_min(uint32_t fd)

{
  fio_data_s *pfVar1;
  fio_lock_i ret;
  
  if (fio_data->max_protocol_fd <= fd) {
    fio_lock(&fio_data->lock);
    pfVar1 = fio_data;
    if (fio_data->max_protocol_fd < fd) {
      fio_data->max_protocol_fd = fd;
    }
    LOCK();
    pfVar1->lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

static void fio_max_fd_min(uint32_t fd) {
  if (fio_data->max_protocol_fd > fd)
    return;
  fio_lock(&fio_data->lock);
  if (fio_data->max_protocol_fd < fd)
    fio_data->max_protocol_fd = fd;
  fio_unlock(&fio_data->lock);
}